

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall
QGraphicsWidget::setAttribute(QGraphicsWidget *this,WidgetAttribute attribute,bool on)

{
  ushort uVar1;
  sbyte sVar2;
  ushort uVar3;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)attribute < 0x37) {
    if ((int)attribute < 0x24) {
      if (attribute == WA_OpaquePaintEvent) {
        sVar2 = 6;
      }
      else {
        if (attribute != WA_NoSystemBackground) {
LAB_0063aa2e:
          local_28[0] = '\x02';
          local_28[1] = '\0';
          local_28[2] = '\0';
          local_28[3] = '\0';
          local_28[4] = '\0';
          local_28[5] = '\0';
          local_28[6] = '\0';
          local_28[7] = '\0';
          local_28[8] = '\0';
          local_28[9] = '\0';
          local_28[10] = '\0';
          local_28[0xb] = '\0';
          local_28[0xc] = '\0';
          local_28[0xd] = '\0';
          local_28[0xe] = '\0';
          local_28[0xf] = '\0';
          local_28[0x10] = '\0';
          local_28[0x11] = '\0';
          local_28[0x12] = '\0';
          local_28[0x13] = '\0';
          local_28[0x14] = '\0';
          local_28[0x15] = '\0';
          local_28[0x16] = '\0';
          local_28[0x17] = '\0';
          local_10 = "default";
          QMessageLogger::warning
                    (local_28,"QGraphicsWidget::setAttribute: unsupported attribute %d",attribute);
          goto LAB_0063aa19;
        }
        sVar2 = 5;
      }
    }
    else if (attribute == WA_SetPalette) {
      sVar2 = 7;
    }
    else if (attribute == WA_SetFont) {
      sVar2 = 8;
    }
    else {
      if (attribute != WA_Resized) goto LAB_0063aa2e;
      sVar2 = 3;
    }
  }
  else if ((int)attribute < 0x39) {
    if (attribute == WA_DeleteOnClose) {
      sVar2 = 4;
    }
    else {
      if (attribute != WA_RightToLeft) goto LAB_0063aa2e;
      sVar2 = 1;
    }
  }
  else if (attribute == WA_SetLayoutDirection) {
    sVar2 = 0;
  }
  else if (attribute == WA_WindowPropagation) {
    sVar2 = 9;
  }
  else {
    if (attribute != WA_SetStyle) goto LAB_0063aa2e;
    sVar2 = 2;
  }
  uVar3 = *(ushort *)(*(long *)(this + 0x18) + 0x1b4);
  uVar1 = (ushort)(1 << sVar2);
  if (on) {
    uVar3 = uVar3 | uVar1;
  }
  else {
    uVar3 = uVar3 & (~uVar1 | 0xfc00);
  }
  *(ushort *)(*(long *)(this + 0x18) + 0x1b4) = uVar3;
LAB_0063aa19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setAttribute(Qt::WidgetAttribute attribute, bool on)
{
    Q_D(QGraphicsWidget);
    // ### most flags require some immediate action
    // ### we might want to qWarn use of unsupported attributes
    // ### we might want to not use Qt::WidgetAttribute, but roll our own instead
    d->setAttribute(attribute, on);
}